

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isWellFormedAddress(XMLCh *addrString,XMLSize_t addrStrLen)

{
  bool bVar1;
  ulong local_30;
  XMLSize_t i;
  uint labelCharCount;
  int lastPeriodPos;
  XMLSize_t addrStrLen_local;
  XMLCh *addrString_local;
  
  if (addrStrLen == 0) {
    addrString_local._7_1_ = false;
  }
  else if (*addrString == L'[') {
    addrString_local._7_1_ = isWellFormedIPv6Reference(addrString,addrStrLen);
  }
  else if (((*addrString == L'.') || (*addrString == L'-')) || (addrString[addrStrLen - 1] == L'-'))
  {
    addrString_local._7_1_ = false;
  }
  else {
    i._4_4_ = XMLString::lastIndexOf(L'.',addrString,addrStrLen);
    if ((long)(i._4_4_ + 1) == addrStrLen) {
      i._4_4_ = XMLString::lastIndexOf(L'.',addrString,(long)i._4_4_);
      bVar1 = XMLString::isDigit(addrString[i._4_4_ + 1]);
      if (bVar1) {
        return false;
      }
    }
    bVar1 = XMLString::isDigit(addrString[i._4_4_ + 1]);
    if (bVar1) {
      addrString_local._7_1_ = isWellFormedIPv4Address(addrString,addrStrLen);
    }
    else if (addrStrLen < 0x100) {
      i._0_4_ = 0;
      for (local_30 = 0; local_30 < addrStrLen; local_30 = local_30 + 1) {
        if (addrString[local_30] == L'.') {
          if (((local_30 != 0) && (bVar1 = XMLString::isAlphaNum(addrString[local_30 - 1]), !bVar1))
             || ((local_30 + 1 < addrStrLen &&
                 (bVar1 = XMLString::isAlphaNum(addrString[local_30 + 1]), !bVar1)))) {
            return false;
          }
          i._0_4_ = 0;
        }
        else {
          bVar1 = XMLString::isAlphaNum(addrString[local_30]);
          if ((!bVar1) && (addrString[local_30] != L'-')) {
            return false;
          }
          i._0_4_ = (uint)i + 1;
          if (0x3f < (uint)i) {
            return false;
          }
        }
      }
      addrString_local._7_1_ = true;
    }
    else {
      addrString_local._7_1_ = false;
    }
  }
  return addrString_local._7_1_;
}

Assistant:

bool XMLUri::isWellFormedAddress(const XMLCh* const addrString,
                                 const XMLSize_t addrStrLen)
{
    // Check that we have a non-zero length string.
    if (addrStrLen == 0)
        return false;

    // Check if the host is a valid IPv6reference.
    if (*addrString == chOpenSquare)
    {
        return isWellFormedIPv6Reference(addrString, addrStrLen);
    }

    //
    // Cannot start with a '.', '-', or end with a '-'.
    //
    if (*addrString == chPeriod ||
        *addrString == chDash ||
        addrString[addrStrLen-1] == chDash)
        return false;

    // rightmost domain label starting with digit indicates IP address
    // since top level domain label can only start with an alpha
    // see RFC 2396 Section 3.2.2

    int lastPeriodPos = XMLString::lastIndexOf(chPeriod, addrString, addrStrLen);

    // if the string ends with "."
    // get the second last "."
    if (XMLSize_t(lastPeriodPos + 1) == addrStrLen)
    {
        lastPeriodPos = XMLString::lastIndexOf(chPeriod, addrString, lastPeriodPos);

        if ( XMLString::isDigit(addrString[lastPeriodPos + 1]))
			return false;
    }

    if (XMLString::isDigit(addrString[lastPeriodPos + 1]))
    {
        return isWellFormedIPv4Address(addrString, addrStrLen);
    } // end of IPv4address
    else
    {
        //
        //  hostname      = *( domainlabel "." ) toplabel [ "." ]
        //  domainlabel   = alphanum | alphanum *( alphanum | "-" ) alphanum
        //  toplabel      = alpha | alpha *( alphanum | "-" ) alphanum

        // RFC 2396 states that hostnames take the form described in
        // RFC 1034 (Section 3) and RFC 1123 (Section 2.1). According
        // to RFC 1034, hostnames are limited to 255 characters.
        if (addrStrLen > 255) {
            return false;
        }

        unsigned int labelCharCount = 0;

        // domain labels can contain alphanumerics and '-"
        // but must start and end with an alphanumeric
        for (XMLSize_t i = 0; i < addrStrLen; i++)
        {
            if (addrString[i] == chPeriod)
            {
              if (((i > 0)  &&
                   (!XMLString::isAlphaNum(addrString[i-1]))) ||
                  ((i + 1 < addrStrLen) &&
                   (!XMLString::isAlphaNum(addrString[i+1])))  )
                {
                    return false;
                }
                labelCharCount = 0;
            }
            else if (!XMLString::isAlphaNum(addrString[i]) &&
                      addrString[i] != chDash)
            {
                return false;
            }
            // RFC 1034: Labels must be 63 characters or less.
            else if (++labelCharCount > 63) {
                return false;
            }
        } //for
    }

    return true;
}